

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DList.h
# Opt level: O0

bool __thiscall
DListBase<unsigned_long,_RealCount>::Append<Memory::HeapAllocator>
          (DListBase<unsigned_long,_RealCount> *this,HeapAllocator *allocator,unsigned_long *data)

{
  HeapAllocator *alloc;
  DListNode<unsigned_long> *this_00;
  DListNodeBase<unsigned_long> **ppDVar1;
  TrackAllocData local_58;
  DListNode<unsigned_long> *local_30;
  Node *newNode;
  unsigned_long *data_local;
  HeapAllocator *allocator_local;
  DListBase<unsigned_long,_RealCount> *this_local;
  
  newNode = (Node *)data;
  data_local = (unsigned_long *)allocator;
  allocator_local = (HeapAllocator *)this;
  Memory::TrackAllocData::CreateTrackAllocData
            (&local_58,(type_info *)&DListNode<unsigned_long>::typeinfo,0,0xffffffffffffffff,
             "/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/DataStructures/DList.h"
             ,0xf0);
  alloc = Memory::HeapAllocator::TrackAllocInfo(allocator,&local_58);
  this_00 = (DListNode<unsigned_long> *)new<Memory::HeapAllocator>(0x18,alloc,0x350bd0);
  DListNode<unsigned_long>::DListNode(this_00,(unsigned_long *)newNode);
  if (this_00 != (DListNode<unsigned_long> *)0x0) {
    local_30 = this_00;
    ppDVar1 = DListNodeBase<unsigned_long>::Prev(&this->super_DListNodeBase<unsigned_long>);
    InsertNodeAfter(*ppDVar1,&local_30->super_DListNodeBase<unsigned_long>);
    RealCount::IncrementCount(&this->super_RealCount);
  }
  return this_00 != (DListNode<unsigned_long> *)0x0;
}

Assistant:

bool Append(TAllocator * allocator, TData const& data)
    {
        Node * newNode = AllocatorNew(TAllocator, allocator, Node, data);
        if (newNode)
        {
            DListBase::InsertNodeAfter(this->Prev(), newNode);
            this->IncrementCount();
            return true;
        }
        return false;
    }